

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix4.c
# Opt level: O0

char * test_matrix4_transformation_translatev3_negative(void)

{
  int iVar1;
  undefined1 local_d8 [8];
  vector3 expectedPosition;
  vector3 translation;
  vector3 startingPosition;
  matrix4 transform;
  
  translation.field_0.v[2] = 0.0;
  startingPosition.field_0.v[0] = 1.0;
  startingPosition.field_0.v[1] = 0.0;
  expectedPosition.field_0.v[2] = -0.10000000149011612;
  translation.field_0.v[0] = -0.10000000149011612;
  translation.field_0.v[1] = -0.10000000149011612;
  local_d8 = (undefined1  [8])0xbfb99999a0000000;
  expectedPosition.field_0.v[0] = 0.8999999761581421;
  expectedPosition.field_0.v[1] = -0.10000000149011612;
  matrix4_make_transformation_translationv3
            ((matrix4 *)((long)&startingPosition.field_0 + 0x10),
             (vector3 *)((long)&expectedPosition.field_0 + 0x10));
  vector3_multiplym4((vector3 *)((long)&translation.field_0 + 0x10),
                     (matrix4 *)((long)&startingPosition.field_0 + 0x10));
  iVar1 = vector3_equals((vector3 *)((long)&translation.field_0 + 0x10),(vector3 *)local_d8);
  if (iVar1 == 0) {
    transform.field_0.m[0xf] = (double)anon_var_dwarf_76a;
  }
  else {
    transform.field_0.m[0xf] = 0.0;
  }
  return (char *)transform.field_0.m[0xf];
}

Assistant:

static char *test_matrix4_transformation_translatev3_negative(void)
{
	struct matrix4 transform;

	struct vector3 startingPosition = {0.0f, 1.0f, 0.0f};
	struct vector3 translation = {-0.1f, -0.1f, -0.1f};
	struct vector3 expectedPosition = {-0.1f, 0.9f, -0.1f};

	matrix4_make_transformation_translationv3(&transform, &translation);
	vector3_multiplym4(&startingPosition, &transform);
	test_assert(vector3_equals(&startingPosition, &expectedPosition));

	return NULL;
}